

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O3

unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
 __thiscall
duckdb::UncompressedStringStorage::StringInitSegment
          (UncompressedStringStorage *this,ColumnSegment *segment,block_id_t block_id,
          optional_ptr<duckdb::ColumnSegmentState,_true> segment_state)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  pointer plVar4;
  pointer plVar5;
  optional_ptr<duckdb::ColumnSegmentState,_true> oVar6;
  BufferManager *pBVar7;
  idx_t iVar8;
  element_type *peVar9;
  pointer pUVar10;
  BufferHandle handle;
  optional_ptr<duckdb::ColumnSegmentState,_true> local_40;
  BufferHandle local_38;
  
  local_40.ptr = segment_state.ptr;
  pBVar7 = BufferManager::GetBufferManager(segment->db);
  if (block_id == -1) {
    (*pBVar7->_vptr_BufferManager[7])(&local_38,pBVar7,&segment->block);
    iVar8 = ColumnSegment::SegmentSize(segment);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_38.node);
    pdVar2 = (local_38.node.ptr)->buffer;
    iVar3 = segment->offset;
    pdVar1 = pdVar2 + iVar3;
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    *(int *)(pdVar2 + iVar3 + 4) = (int)iVar8;
    BufferHandle::~BufferHandle(&local_38);
  }
  peVar9 = (element_type *)operator_new(0xd0);
  switchD_012e5a64::default
            ((void *)((long)&(peVar9->lock).super___mutex_base._M_mutex + 0x18),0,0x90);
  (peVar9->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__UncompressedStringSegmentState_0246eaf0;
  (peVar9->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar9->block_manager = (BlockManager *)&peVar9->state;
  (peVar9->lock).super___mutex_base._M_mutex.__align = 1;
  *(undefined8 *)((long)&(peVar9->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(peVar9->lock).super___mutex_base._M_mutex + 0x10) = 0;
  *(undefined4 *)((long)&(peVar9->lock).super___mutex_base._M_mutex + 0x18) = 0x3f800000;
  (peVar9->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  peVar9->state = BLOCK_UNLOADED;
  *(undefined3 *)&peVar9->field_0x41 = 0;
  peVar9->readers = (__atomic_base<int>)0x0;
  peVar9->block_id = 0;
  peVar9->tag = BASE_TABLE;
  peVar9->buffer_type = 0;
  *(undefined6 *)&peVar9->field_0x52 = 0;
  (peVar9->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
  _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
  super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
  (peVar9->eviction_seq_num).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar9->lru_timestamp_msec).super___atomic_base<long>._M_i = 0;
  *(undefined8 *)&peVar9->destroy_buffer_upon = 0;
  (peVar9->memory_usage).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&peVar9->memory_charge = 0;
  (peVar9->memory_charge).size = 0;
  (peVar9->memory_charge).pool = (BufferPool *)0x0;
  peVar9->unswizzled = (char *)((long)&peVar9[1].lock.super___mutex_base._M_mutex + 8);
  (peVar9->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i = 1;
  peVar9[1].super_enable_shared_from_this<duckdb::BlockHandle>.__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar9[1].super_enable_shared_from_this<duckdb::BlockHandle>.__weak_this_.internal.
  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&peVar9[1].block_manager = 0x3f800000;
  peVar9[1].lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&peVar9[1].lock.super___mutex_base._M_mutex + 8) = 0;
  local_38.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar9;
  if (segment_state.ptr != (ColumnSegmentState *)0x0) {
    optional_ptr<duckdb::ColumnSegmentState,_true>::CheckValid(&local_40);
    oVar6.ptr = local_40.ptr;
    pUVar10 = unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
              ::operator->((unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
                            *)&local_38);
    plVar4 = (pUVar10->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
    plVar5 = ((oVar6.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    (pUVar10->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         ((oVar6.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    (pUVar10->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         plVar5;
    (pUVar10->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         ((oVar6.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    ((oVar6.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((oVar6.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    ((oVar6.ptr)->blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (plVar4 != (pointer)0x0) {
      operator_delete(plVar4);
    }
  }
  *(element_type **)this =
       local_38.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  return (unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
          )(unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
            )this;
}

Assistant:

unique_ptr<CompressedSegmentState>
UncompressedStringStorage::StringInitSegment(ColumnSegment &segment, block_id_t block_id,
                                             optional_ptr<ColumnSegmentState> segment_state) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	if (block_id == INVALID_BLOCK) {
		auto handle = buffer_manager.Pin(segment.block);
		StringDictionaryContainer dictionary;
		dictionary.size = 0;
		dictionary.end = UnsafeNumericCast<uint32_t>(segment.SegmentSize());
		SetDictionary(segment, handle, dictionary);
	}
	auto result = make_uniq<UncompressedStringSegmentState>();
	if (segment_state) {
		auto &serialized_state = segment_state->Cast<SerializedStringSegmentState>();
		result->on_disk_blocks = std::move(serialized_state.blocks);
	}
	return std::move(result);
}